

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,int n)

{
  ImU32 IVar1;
  uint *puVar2;
  long in_RDI;
  ImGuiID seed;
  undefined1 local_c [12];
  
  puVar2 = ImVector<unsigned_int>::back((ImVector<unsigned_int> *)(in_RDI + 0xf8));
  IVar1 = ImHashData(local_c,4,*puVar2);
  return IVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(int n)
{
    ImGuiID seed = IDStack.back();
    return ImHashData(&n, sizeof(n), seed);
}